

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::session_impl
          (session_impl *this,io_context *ioc,
          vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> *pack,
          disk_io_constructor_type *disk_io_constructor,session_flags_t flags)

{
  session_settings *this_00;
  counters *this_01;
  atomic_count *paVar1;
  _Rb_tree_header *p_Var2;
  io_context *piVar3;
  int queue_limit;
  alert_category_t alert_mask;
  long lVar4;
  function<std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&)>
  local_1b8;
  deadline_timer *local_198;
  utp_socket_manager *local_190;
  utp_socket_manager *local_188;
  deadline_timer *local_180;
  i2p_connection *local_178;
  port_filter *local_170;
  ip_filter *local_168;
  torrent_list<libtorrent::aux::torrent> *local_160;
  tracker_manager *local_158;
  bandwidth_manager *local_150;
  bandwidth_manager *local_148;
  unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>
  *local_140;
  alert_manager *local_138;
  context *local_130;
  torrent_peer_allocator *local_128;
  peer_class_pool *local_120;
  array<aux::vector<torrent_*>,_num_torrent_lists,_torrent_list_index_t> *local_118;
  condition_variable *local_110;
  incoming_utp_callback_t local_108;
  send_fun_t local_e8;
  send_fun_t local_c8;
  send_fun_hostname_t local_a8;
  send_fun_t local_88;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>,_std::_Placeholder<6>))(const_libtorrent::aux::listen_socket_handle_&,_const_char_*,_int,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>
  local_48;
  
  (this->super_enable_shared_from_this<libtorrent::aux::session_impl>)._M_weak_this.
  super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<libtorrent::aux::session_impl>)._M_weak_this.
  super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_session_interface).super_session_logger._vptr_session_logger =
       (_func_int **)&PTR_should_log_004cc068;
  (this->super_dht_observer).super_dht_logger._vptr_dht_logger =
       (_func_int **)&PTR_should_log_004cc380;
  (this->super_portmap_callback)._vptr_portmap_callback =
       (_func_int **)&PTR_on_port_mapping_004cc3d8;
  (this->super_lsd_callback)._vptr_lsd_callback = (_func_int **)&DAT_004cc400;
  (this->super_error_handler_interface)._vptr_error_handler_interface =
       (_func_int **)&PTR_on_exception_004cc428;
  (this->mut).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mut).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mut).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mut).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mut).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_110 = &this->cond;
  ::std::condition_variable::condition_variable(local_110);
  this_00 = &this->m_settings;
  session_settings::session_settings(this_00,(settings_pack *)pack);
  local_118 = &this->m_torrent_lists;
  memset(local_118,0,0xc0);
  local_120 = &this->m_classes;
  peer_class_pool::peer_class_pool(local_120);
  this_01 = &this->m_stats_counters;
  counters::counters(this_01);
  local_128 = &this->m_peer_allocator;
  torrent_peer_allocator::torrent_peer_allocator(local_128);
  (this->m_block_info_storage).
  super__Vector_base<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_block_info_storage).
  super__Vector_base<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_block_info_storage).
  super__Vector_base<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_io_context = ioc;
  boost::asio::ssl::context::context(&this->m_ssl_ctx,tls_client);
  local_130 = &this->m_ssl_ctx;
  boost::asio::ssl::context::context(&this->m_peer_ssl_ctx,tls);
  queue_limit = session_settings::get_int(this_00,0x4063);
  alert_mask.m_val = session_settings::get_int(this_00,0x4075);
  local_138 = &this->m_alerts;
  alert_manager::alert_manager(local_138,queue_limit,alert_mask);
  if ((disk_io_constructor->super__Function_base)._M_manager == (_Manager_type)0x0) {
    local_1b8.super__Function_base._M_functor._8_8_ = 0;
    local_1b8.super__Function_base._M_functor._M_unused._M_function_pointer =
         default_disk_io_constructor;
    local_1b8._M_invoker =
         ::std::
         _Function_handler<std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&),_std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(*)(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&)>
         ::_M_invoke;
    local_1b8.super__Function_base._M_manager =
         ::std::
         _Function_handler<std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&),_std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(*)(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&)>
         ::_M_manager;
  }
  else {
    ::std::
    function<std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&)>
    ::function(&local_1b8,disk_io_constructor);
  }
  ::std::
  function<std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&)>
  ::operator()((function<std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&)>
                *)&this->m_disk_thread,(io_context *)&local_1b8,
               (settings_interface *)this->m_io_context,(counters *)this_00);
  ::std::_Function_base::~_Function_base(&local_1b8.super__Function_base);
  local_140 = &this->m_disk_thread;
  bandwidth_manager::bandwidth_manager(&this->m_download_rate,1);
  local_150 = &this->m_upload_rate;
  local_148 = &this->m_download_rate;
  bandwidth_manager::bandwidth_manager(local_150,0);
  this->m_global_class = 0;
  this->m_tcp_peer_class = 0;
  (this->m_local_peer_class).m_val = 0;
  resolver::resolver(&this->m_host_resolver,this->m_io_context);
  local_1b8.super__Function_base._M_functor._M_unused._M_object = send_udp_packet_listen;
  local_1b8.super__Function_base._M_functor._8_8_ = 0;
  local_1b8.super__Function_base._M_manager = (_Manager_type)this;
  ::std::
  function<void(libtorrent::aux::listen_socket_handle_const&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>
  ::
  function<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>,std::_Placeholder<5>))(libtorrent::aux::listen_socket_handle_const&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>,void>
            ((function<void(libtorrent::aux::listen_socket_handle_const&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>
              *)&local_88,
             (_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>))(const_libtorrent::aux::listen_socket_handle_&,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>
              *)&local_1b8);
  local_48._M_f = (offset_in_session_impl_to_subr)send_udp_packet_hostname_listen;
  local_48._8_8_ = 0;
  local_48._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>,_std::_Placeholder<6>_>
  .super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>,_std::_Placeholder<6>_>
        )(_Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>,_std::_Placeholder<6>_>
          )this;
  ::std::
  function<void(libtorrent::aux::listen_socket_handle_const&,char_const*,int,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>
  ::
  function<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>,std::_Placeholder<5>,std::_Placeholder<6>))(libtorrent::aux::listen_socket_handle_const&,char_const*,int,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>,void>
            ((function<void(libtorrent::aux::listen_socket_handle_const&,char_const*,int,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>
              *)&local_a8,&local_48);
  local_158 = &this->m_tracker_manager;
  tracker_manager::tracker_manager
            (local_158,&local_88,&local_a8,this_01,&(this->m_host_resolver).super_resolver_interface
             ,this_00,(session_logger *)this);
  ::std::_Function_base::~_Function_base(&local_a8.super__Function_base);
  ::std::_Function_base::~_Function_base(&local_88.super__Function_base);
  local_160 = &this->m_torrents;
  torrent_list<libtorrent::aux::torrent>::torrent_list(local_160);
  (this->m_undead_peers).
  super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_undead_peers).
  super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_download_queue).
  super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>.
  super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_undead_peers).
  super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_download_queue).
  super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>.
  super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_download_queue).
  super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>.
  super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  piVar3 = this->m_io_context;
  (this->m_work).executor_.io_context_ = piVar3;
  (this->m_work).executor_.bits_ = 0;
  (this->m_work).owns_ = true;
  LOCK();
  paVar1 = &piVar3->impl_->outstanding_work_;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  p_Var2 = &(this->m_connections)._M_t._M_impl.super__Rb_tree_header;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_incoming_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_incoming_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  p_Var2 = &(this->m_incoming_sockets)._M_t._M_impl.super__Rb_tree_header;
  (this->m_incoming_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->m_incoming_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->m_incoming_sockets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_168 = &this->m_peer_class_filter;
  ip_filter::ip_filter(local_168);
  peer_class_type_filter::peer_class_type_filter(&this->m_peer_class_type_filter);
  (this->m_ip_filter).super___shared_ptr<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_ip_filter).super___shared_ptr<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_170 = &this->m_port_filter;
  port_filter::port_filter(local_170);
  local_178 = &this->m_i2p_conn;
  (this->m_listen_sockets).
  super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_listen_sockets).
  super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_outgoing_interfaces).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_listen_sockets).
  super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_outgoing_interfaces).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_outgoing_interfaces).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_listen_interfaces).
  super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_listen_interfaces).
  super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_ip_notifier)._M_t.
  super___uniq_ptr_impl<libtorrent::aux::ip_change_notifier,_std::default_delete<libtorrent::aux::ip_change_notifier>_>
  ._M_t.
  super__Tuple_impl<0UL,_libtorrent::aux::ip_change_notifier_*,_std::default_delete<libtorrent::aux::ip_change_notifier>_>
  .super__Head_base<0UL,_libtorrent::aux::ip_change_notifier_*,_false>._M_head_impl =
       (ip_change_notifier *)0x0;
  (this->m_listen_interfaces).
  super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this->m_listen_socket_version = 0;
  i2p_connection::i2p_connection(local_178,this->m_io_context);
  (this->m_i2p_listen_socket).
  super__Optional_base<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>,_true,_false,_false>
  .
  super__Optional_payload_base<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>_>
  ._M_engaged = false;
  this->m_interface_index = '\0';
  (this->m_dht_state).nids.
  super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dht_state).nids.
  super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_dht_state).nids.
  super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_dht_state).nodes.
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dht_state).nodes.
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_dht_state).nodes.
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_dht_state).nodes6.
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dht_state).nodes6.
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_dht_state).nodes6.
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_unchoke_time_scaler = 0;
  this->m_auto_manage_time_scaler = 0;
  this->m_optimistic_unchoke_time_scaler = 0;
  this->m_disconnect_time_scaler = 0x5a;
  this->m_auto_scrape_time_scaler = 0xb4;
  *(undefined8 *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL> = 0;
  *(undefined8 *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x8 =
       0;
  *(undefined8 *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x10 =
       0;
  *(undefined8 *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x18 =
       0;
  *(undefined8 *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x20 =
       0;
  *(undefined8 *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x28 =
       0;
  *(undefined8 *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x30 =
       0;
  *(undefined8 *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x38 =
       0;
  *(undefined8 *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x40 =
       0;
  *(undefined8 *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x48 =
       0;
  *(undefined8 *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x50 =
       0;
  *(undefined8 *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x58 =
       0;
  lVar4 = ::std::chrono::_V2::system_clock::now();
  (this->m_created).__d.__r = lVar4;
  (this->m_last_tick).__d.__r = lVar4;
  (this->m_last_second_tick).__d.__r = lVar4 + -900000000;
  (this->m_last_choke).__d.__r = lVar4;
  (this->m_last_auto_manage).__d.__r = lVar4;
  this->m_next_port = 0;
  *(undefined8 *)((long)&(this->m_dht_storage_constructor).super__Function_base._M_functor + 8) = 0;
  (this->m_dht).super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_dht_storage)._M_t.
  super___uniq_ptr_impl<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>
  ._M_t.
  super__Tuple_impl<0UL,_libtorrent::dht::dht_storage_interface_*,_std::default_delete<libtorrent::dht::dht_storage_interface>_>
  .super__Head_base<0UL,_libtorrent::dht::dht_storage_interface_*,_false>._M_head_impl =
       (dht_storage_interface *)0x0;
  (this->m_dht).super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  *(code **)&(this->m_dht_storage_constructor).super__Function_base._M_functor =
       libtorrent::dht::dht_default_storage_constructor;
  (this->m_dht_storage_constructor)._M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>_(const_libtorrent::settings_interface_&),_std::unique_ptr<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>_(*)(const_libtorrent::settings_interface_&)>
       ::_M_invoke;
  (this->m_dht_storage_constructor).super__Function_base._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>_(const_libtorrent::settings_interface_&),_std::unique_ptr<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>_(*)(const_libtorrent::settings_interface_&)>
       ::_M_manager;
  local_180 = &this->m_dht_announce_timer;
  (this->m_dht_router_nodes).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dht_router_nodes).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_dht_router_nodes).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_dht_nodes).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dht_nodes).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_dht_nodes).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>(&local_180->impl_,this->m_io_context,(type *)0x0);
  this->m_dht_interval_update_torrents = 0;
  this->m_outstanding_router_lookups = 0;
  local_1b8.super__Function_base._M_functor._M_unused._M_object = send_udp_packet;
  local_1b8.super__Function_base._M_functor._8_8_ = 0;
  local_1b8.super__Function_base._M_manager = (_Manager_type)this;
  ::std::
  function<void(std::weak_ptr<libtorrent::aux::utp_socket_interface>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>
  ::
  function<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>,std::_Placeholder<5>))(std::weak_ptr<libtorrent::aux::utp_socket_interface>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>,void>
            ((function<void(std::weak_ptr<libtorrent::aux::utp_socket_interface>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>
              *)&local_c8,
             (_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>))(std::weak_ptr<libtorrent::aux::utp_socket_interface>,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>
              *)&local_1b8);
  local_68._8_8_ = 0;
  local_188 = &this->m_utp_socket_manager;
  local_50 = ::std::_Function_handler<$55b7542e$>::_M_invoke;
  local_58 = ::std::_Function_handler<$55b7542e$>::_M_manager;
  local_68._M_unused._M_object = this;
  aux::utp_socket_manager::utp_socket_manager
            (local_188,&local_c8,(incoming_utp_callback_t *)&local_68,this->m_io_context,this_00,
             this_01,(void *)0x0);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_68);
  ::std::_Function_base::~_Function_base(&local_c8.super__Function_base);
  local_1b8.super__Function_base._M_functor._M_unused._M_object = send_udp_packet;
  local_1b8.super__Function_base._M_functor._8_8_ = 0;
  local_1b8.super__Function_base._M_manager = (_Manager_type)this;
  ::std::
  function<void(std::weak_ptr<libtorrent::aux::utp_socket_interface>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>
  ::
  function<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>,std::_Placeholder<5>))(std::weak_ptr<libtorrent::aux::utp_socket_interface>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>,void>
            ((function<void(std::weak_ptr<libtorrent::aux::utp_socket_interface>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>
              *)&local_e8,
             (_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>))(std::weak_ptr<libtorrent::aux::utp_socket_interface>,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>
              *)&local_1b8);
  local_48._M_f = (offset_in_session_impl_to_subr)on_incoming_utp_ssl;
  local_48._8_8_ = 0;
  local_48._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>,_std::_Placeholder<6>_>
  .super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>,_std::_Placeholder<6>_>
        )(_Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>,_std::_Placeholder<6>_>
          )this;
  ::std::
  function<void(libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>)>
  ::
  function<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>)>,void>
            ((function<void(libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>)>
              *)&local_108,
             (_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>)>
              *)&local_48);
  aux::utp_socket_manager::utp_socket_manager
            (&this->m_ssl_utp_socket_manager,&local_e8,&local_108,this->m_io_context,this_00,this_01
             ,&this->m_peer_ssl_ctx);
  ::std::_Function_base::~_Function_base(&local_108.super__Function_base);
  ::std::_Function_base::~_Function_base(&local_e8.super__Function_base);
  this->m_boost_connections = 0;
  local_190 = &this->m_ssl_utp_socket_manager;
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>(&(this->m_timer).impl_,this->m_io_context,(type *)0x0);
  local_198 = &this->m_timer;
  ::std::
  _Deque_base<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
  ::_Deque_base(&(this->m_dht_torrents).
                 super__Deque_base<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
               );
  ::std::
  _Deque_base<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
  ::_Deque_base(&(this->m_prio_torrents).
                 super__Deque_base<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
               );
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>
            (&(this->m_lsd_announce_timer).impl_,this->m_io_context,(type *)0x0);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>
            (&(this->m_close_file_timer).impl_,this->m_io_context,(type *)0x0);
  memset(&this->m_next_downloading_connect_torrent,0,0x8c);
  this->m_paused = (bool)(flags.m_val >> 2 & 1);
  this->m_posted_stats_header = false;
  validate_settings(this);
  return;
}

Assistant:

session_impl::session_impl(io_context& ioc, settings_pack const& pack
		, disk_io_constructor_type disk_io_constructor
		, session_flags_t const flags)
		: m_settings(pack)
		, m_io_context(ioc)
#if TORRENT_USE_SSL
		, m_ssl_ctx(ssl::context::tls_client)
#ifdef TORRENT_SSL_PEERS
		, m_peer_ssl_ctx(ssl::context::tls)
#endif
#endif // TORRENT_USE_SSL
		, m_alerts(m_settings.get_int(settings_pack::alert_queue_size)
			, alert_category_t{static_cast<unsigned int>(m_settings.get_int(settings_pack::alert_mask))})
		, m_disk_thread((disk_io_constructor ? disk_io_constructor : default_disk_io_constructor)
			(m_io_context, m_settings, m_stats_counters))
		, m_download_rate(peer_connection::download_channel)
		, m_upload_rate(peer_connection::upload_channel)
		, m_host_resolver(m_io_context)
		, m_tracker_manager(
			std::bind(&session_impl::send_udp_packet_listen, this, _1, _2, _3, _4, _5)
			, std::bind(&session_impl::send_udp_packet_hostname_listen, this, _1, _2, _3, _4, _5, _6)
			, m_stats_counters
			, m_host_resolver
			, m_settings
#if !defined TORRENT_DISABLE_LOGGING || TORRENT_USE_ASSERTS
			, *this
#endif
			)
		, m_work(make_work_guard(m_io_context))
#if TORRENT_USE_I2P
		, m_i2p_conn(m_io_context)
#endif
		, m_created(clock_type::now())
		, m_last_tick(m_created)
		, m_last_second_tick(m_created - milliseconds(900))
		, m_last_choke(m_created)
		, m_last_auto_manage(m_created)
#ifndef TORRENT_DISABLE_DHT
		, m_dht_announce_timer(m_io_context)
#endif
		, m_utp_socket_manager(
			std::bind(&session_impl::send_udp_packet, this, _1, _2, _3, _4, _5)
			, [this](socket_type s) { this->incoming_connection(std::move(s)); }
			, m_io_context
			, m_settings, m_stats_counters, nullptr)
#ifdef TORRENT_SSL_PEERS
		, m_ssl_utp_socket_manager(
			std::bind(&session_impl::send_udp_packet, this, _1, _2, _3, _4, _5)
			, std::bind(&session_impl::on_incoming_utp_ssl, this, _1)
			, m_io_context
			, m_settings, m_stats_counters
			, &m_peer_ssl_ctx)
#endif
		, m_timer(m_io_context)
		, m_lsd_announce_timer(m_io_context)
		, m_close_file_timer(m_io_context)
		, m_paused(flags & session::paused)
	{
#if !defined TORRENT_DISABLE_LOGGING || TORRENT_USE_ASSERTS
		validate_settings();
#endif
	}